

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmuuidgen.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  ui32_t i;
  long lVar4;
  CommandOptions Options;
  UUID UUID;
  char uuid_buf [40];
  
  CommandOptions::CommandOptions(&Options,argc,argv);
  if (Options.version_flag == true) {
    banner((FILE *)_stdout);
  }
  if (Options.help_flag == true) {
    usage((FILE *)_stdout);
  }
  iVar2 = 0;
  iVar3 = 0;
  if ((Options.version_flag == false) && (Options.help_flag == false)) {
    if (Options.error_flag == true) {
      fprintf(_stderr,"There was a problem. Type %s -h for help.\n",PROGRAM_NAME);
      iVar3 = 3;
    }
    else {
      UUID.super_Identifier<16U>.m_HasValue = false;
      UUID.super_Identifier<16U>.m_Value[0] = '\0';
      UUID.super_Identifier<16U>.m_Value[1] = '\0';
      UUID.super_Identifier<16U>.m_Value[2] = '\0';
      UUID.super_Identifier<16U>.m_Value[3] = '\0';
      UUID.super_Identifier<16U>.m_Value[4] = '\0';
      UUID.super_Identifier<16U>.m_Value[5] = '\0';
      UUID.super_Identifier<16U>.m_Value[6] = '\0';
      UUID.super_Identifier<16U>.m_Value[7] = '\0';
      UUID.super_Identifier<16U>.m_Value[8] = '\0';
      UUID.super_Identifier<16U>.m_Value[9] = '\0';
      UUID.super_Identifier<16U>.m_Value[10] = '\0';
      UUID.super_Identifier<16U>.m_Value[0xb] = '\0';
      UUID.super_Identifier<16U>.m_Value[0xc] = '\0';
      UUID.super_Identifier<16U>.m_Value[0xd] = '\0';
      UUID.super_Identifier<16U>.m_Value[0xe] = '\0';
      UUID.super_Identifier<16U>.m_Value[0xf] = '\0';
      UUID.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_00106d10;
      Kumu::GenRandomValue(&UUID);
      iVar3 = iVar2;
      if (Options.c_array_flag == true) {
        pcVar1 = Kumu::UUID::EncodeHex(&UUID,uuid_buf,0x28);
        printf("byte_t uuid_buf[16] = {\n  // %s\n ",pcVar1);
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          printf(" 0x%02x,",(ulong)UUID.super_Identifier<16U>.m_Value[lVar4]);
        }
        putchar(10);
        puts("};");
      }
      else {
        pcVar1 = Kumu::UUID::EncodeHex(&UUID,uuid_buf,0x28);
        fputs(pcVar1,_stdout);
        if (Options.no_newline_flag == false) {
          putchar(10);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int
main(int argc, const char** argv)
{
  CommandOptions Options(argc, argv);

   if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  Kumu::UUID UUID;
  Kumu::GenRandomValue(UUID);
  char uuid_buf[40];

  if ( Options.c_array_flag )
    {
      const byte_t* p = UUID.Value();

      printf("\
byte_t uuid_buf[16] = {\n\
  // %s\n ",
	     UUID.EncodeHex(uuid_buf, 40));
	  
      for ( ui32_t i = 0; i < 16; i++ )
	printf(" 0x%02x,", p[i]);

      printf("\n");
      printf("};\n");
      return 0;
    }
  else
    {
      fputs(UUID.EncodeHex(uuid_buf, 40), stdout);
    }

  if ( Options.no_newline_flag == 0 )
    printf("\n");

  return 0;
}